

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::MutableMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  ReflectionSchema *this_00;
  uint *puVar1;
  OneofDescriptor *oneof_descriptor;
  long *plVar2;
  uint32 uVar3;
  int iVar4;
  MessageLite *pMVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  long lVar8;
  long *plVar9;
  FieldDescriptor *local_40;
  _func_void_FieldDescriptor_ptr *local_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"MutableMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_38 = FieldDescriptor::TypeOnceInit;
    local_40 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_38,&local_40);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"MutableMessage",CPPTYPE_MESSAGE);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    pMVar5 = internal::ExtensionSet::MutableMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite +
                        (ulong)(uint)(this->schema_).extensions_offset_),field,factory);
  }
  else {
    this_00 = &this->schema_;
    uVar3 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    plVar9 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
    oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
    if (oneof_descriptor == (OneofDescriptor *)0x0) {
      if ((this->schema_).has_bits_offset_ != -1) {
        uVar3 = internal::ReflectionSchema::HasBitIndex(this_00,field);
        puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar3 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
        *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
      }
    }
    else if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)
                                                ) >> 4) * -0x55555554 +
                                  (this->schema_).oneof_case_offset_)) != *(int *)(field + 0x44)) {
      ClearOneof(this,message,oneof_descriptor);
      lVar8 = *(long *)(field + 0x58);
      if (lVar8 == 0) {
        if ((this->schema_).has_bits_offset_ != -1) {
          uVar3 = internal::ReflectionSchema::HasBitIndex(this_00,field);
          puVar1 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar3 >> 5) * 4 + (ulong)(uint)(this->schema_).has_bits_offset_);
          *puVar1 = *puVar1 | 1 << ((byte)uVar3 & 0x1f);
        }
      }
      else {
        *(undefined4 *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar8 - *(long *)(*(long *)(lVar8 + 0x10) + 0x30)) >> 4) *
                       -0x55555554 + (this->schema_).oneof_case_offset_)) =
             *(undefined4 *)(field + 0x44);
      }
      uVar3 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
      plVar9 = (long *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
      puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
      plVar2 = (long *)*puVar6;
      iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
      uVar7 = (**(code **)(*plVar2 + 0x20))(plVar2,iVar4);
      *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3) = uVar7;
    }
    if (*plVar9 == 0) {
      puVar6 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
      plVar2 = (long *)*puVar6;
      iVar4 = (*(message->super_MessageLite)._vptr_MessageLite[5])(message);
      lVar8 = (**(code **)(*plVar2 + 0x20))(plVar2,iVar4);
      *plVar9 = lVar8;
    }
    pMVar5 = (MessageLite *)*plVar9;
  }
  return (Message *)pMVar5;
}

Assistant:

Message* Reflection::MutableMessage(Message* message,
                                    const FieldDescriptor* field,
                                    MessageFactory* factory) const {
  USAGE_CHECK_ALL(MutableMessage, SINGULAR, MESSAGE);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->MutableMessage(field, factory));
  } else {
    Message* result;

    Message** result_holder = MutableRaw<Message*>(message, field);

    if (field->containing_oneof()) {
      if (!HasOneofField(*message, field)) {
        ClearOneof(message, field->containing_oneof());
        result_holder = MutableField<Message*>(message, field);
        const Message* default_message = DefaultRaw<const Message*>(field);
        *result_holder = default_message->New(message->GetArena());
      }
    } else {
      SetBit(message, field);
    }

    if (*result_holder == nullptr) {
      const Message* default_message = DefaultRaw<const Message*>(field);
      *result_holder = default_message->New(message->GetArena());
    }
    result = *result_holder;
    return result;
  }
}